

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.hpp
# Opt level: O1

double __thiscall minimax::Eval<uttt::IBoard>::operator()(Eval<uttt::IBoard> *this,IBoard *game)

{
  IPlayer IVar1;
  int iVar2;
  double dVar3;
  
  iVar2 = uttt::IBoard::GetStatus(game);
  dVar3 = 0.0;
  if (1 < iVar2 + 1U) {
    IVar1 = uttt::IBoard::GetPlayerToMove(game);
    dVar3 = *(double *)(&DAT_00151090 + (ulong)(iVar2 == IVar1) * 8);
  }
  return dVar3;
}

Assistant:

double
Eval<IGame>::operator()(const IGame &game) const
{
    int status = game.GetStatus();
    if (status == game::Draw || status == game::Undecided)
        return 0.0;
    if (game.GetPlayerToMove() == status)
        return std::numeric_limits<double>::max();
    return -std::numeric_limits<double>::max();
}